

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_environment.cpp
# Opt level: O1

void S_UnloadReverbDef(void)

{
  ReverbContainer *pRVar1;
  ReverbContainer *pRVar2;
  ReverbContainer *pRVar3;
  ReverbContainer *pRVar4;
  
  if (Environments != (ReverbContainer *)0x0) {
    pRVar2 = Environments;
    pRVar3 = (ReverbContainer *)0x0;
    do {
      pRVar1 = pRVar2->Next;
      pRVar4 = pRVar2;
      if (pRVar2->Builtin == false) {
        if (pRVar3 != (ReverbContainer *)0x0) {
          pRVar3->Next = pRVar1;
        }
        if (pRVar2->Name != (char *)0x0) {
          operator_delete__(pRVar2->Name);
        }
        operator_delete(pRVar2,0x98);
        pRVar4 = pRVar3;
      }
      pRVar2 = pRVar1;
      pRVar3 = pRVar4;
    } while (pRVar1 != (ReverbContainer *)0x0);
  }
  Environments = &Off;
  return;
}

Assistant:

void S_UnloadReverbDef ()
{
	ReverbContainer *probe = Environments;
	ReverbContainer **pNext = NULL;

	while (probe != NULL)
	{
		ReverbContainer *next = probe->Next;
		if (!probe->Builtin)
		{
			if (pNext != NULL) *pNext = probe->Next;
			delete[] const_cast<char *>(probe->Name);
			delete probe;
		}
		else
		{
			pNext = &probe->Next;
		}
		probe = next;
	}
	Environments = &Off;
}